

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorTables::~FileDescriptorTables(FileDescriptorTables *this)

{
  internal::Mutex::~Mutex(&this->unknown_enum_values_mu_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->locations_by_path_);
  std::
  _Hashtable<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->unknown_enum_values_by_number_);
  std::
  _Hashtable<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->enum_values_by_number_);
  std::
  _Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->fields_by_number_);
  std::
  _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->fields_by_camelcase_name_);
  std::
  _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->fields_by_lowercase_name_);
  std::
  _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this);
  return;
}

Assistant:

FileDescriptorTables::~FileDescriptorTables() {}